

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O2

void __thiscall CCoinsCacheEntry::~CCoinsCacheEntry(CCoinsCacheEntry *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ClearFlags(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&(this->coin).out.scriptPubKey.super_CScriptBase);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCoinsCacheEntry()
    {
        ClearFlags();
    }